

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

void __thiscall QLibrary::~QLibrary(QLibrary *this)

{
  bool bVar1;
  undefined8 *in_RDI;
  QObject *in_stack_00000108;
  
  *in_RDI = &PTR_metaObject_00beed08;
  bVar1 = QTaggedPointer::operator_cast_to_bool
                    ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c550e);
  if (bVar1) {
    QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag>::operator->
              ((QTaggedPointer<QLibraryPrivate,_QLibrary::LoadStatusTag> *)0x8c5522);
    QLibraryPrivate::release((QLibraryPrivate *)0x8c552a);
  }
  QObject::~QObject(in_stack_00000108);
  return;
}

Assistant:

QLibrary::~QLibrary()
{
    if (d)
        d->release();
}